

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfunc.cpp
# Opt level: O0

void __thiscall trun::TestFunc::TestFunc(TestFunc *this)

{
  ILogger *pIVar1;
  allocator<char> local_31;
  string local_30;
  TestFunc *local_10;
  TestFunc *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->moduleName);
  std::__cxx11::string::string((string *)&this->caseName);
  this->state = Idle;
  this->execState = None;
  this->testScope = kUnknown;
  this->pLogger = (ILogger *)0x0;
  std::shared_ptr<trun::IDynLibrary>::shared_ptr(&this->library,(nullptr_t)0x0);
  std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>::
  vector(&this->dependencies);
  this->pFunc = (PTESTFUNC)0x0;
  this->testReturnCode = -1;
  std::shared_ptr<trun::TestResult>::shared_ptr(&this->testResult,(nullptr_t)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"TestFunc",&local_31);
  pIVar1 = gnilk::Logger::GetLogger(&local_30);
  this->pLogger = pIVar1;
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

TestFunc::TestFunc() {
    pLogger = gnilk::Logger::GetLogger("TestFunc");
}